

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionSet.cpp
# Opt level: O0

SelectionSet * __thiscall
OpenMD::SelectionSet::get
          (SelectionSet *this,vector<int,_std::allocator<int>_> *fromIndex,
          vector<int,_std::allocator<int>_> *toIndex)

{
  reference pvVar1;
  reference pvVar2;
  OpenMDBitSet *this_00;
  vector<int,_std::allocator<int>_> *in_RCX;
  SelectionSet *in_RDX;
  vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *in_RSI;
  SelectionSet *in_RDI;
  size_t in_stack_00000058;
  size_t in_stack_00000060;
  OpenMDBitSet *in_stack_00000068;
  int i;
  SelectionSet *result;
  undefined4 local_28;
  
  SelectionSet(in_RDX);
  for (local_28 = 0; local_28 < 6; local_28 = local_28 + 1) {
    pvVar1 = std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::operator[]
                       (in_RSI,(long)local_28);
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)in_RDX,(long)local_28);
    this_00 = (OpenMDBitSet *)(long)*pvVar2;
    std::vector<int,_std::allocator<int>_>::operator[](in_RCX,(long)local_28);
    OpenMDBitSet::get(in_stack_00000068,in_stack_00000060,in_stack_00000058);
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::operator[]
              (&in_RDI->bitsets_,(long)local_28);
    OpenMDBitSet::operator=(this_00,pvVar1);
    OpenMDBitSet::~OpenMDBitSet((OpenMDBitSet *)0x20881c);
  }
  return in_RDI;
}

Assistant:

SelectionSet SelectionSet::get(std::vector<int> fromIndex,
                                 std::vector<int> toIndex) {
    SelectionSet result;

    for (int i = 0; i < N_SELECTIONTYPES; i++)
      result.bitsets_[i] = bitsets_[i].get(fromIndex[i], toIndex[i]);

    return result;
  }